

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

int nextOdd(int x)

{
  int local_10;
  int y;
  int x_local;
  
  local_10 = x;
  if (x % 2 == 0) {
    local_10 = x + 1;
  }
  return local_10;
}

Assistant:

static int nextOdd(int x) {
    int y;
    if (x%2 == 0) {
        y = x+1;
    } else {
        y = x;
    }

    return y;
}